

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboTestUtil.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::FboTestUtil::FlatColorShader::shadeFragments
          (FlatColorShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  int iVar1;
  GenericVec4 *pGVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  Vec4 color;
  UVec4 uicolor;
  IVec4 icolor;
  Vector<float,_4> local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  tcu::Vector<float,_4>::Vector
            (&local_58,
             (float (*) [4])
             &((this->super_ShaderProgram).m_uniforms.
               super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>._M_impl.
               super__Vector_impl_data._M_start)->value);
  castVectorSaturate<int>(&local_58);
  castVectorSaturate<unsigned_int>(&local_58);
  iVar3 = *(int *)&(this->super_ShaderProgram).field_0x154;
  if (iVar3 == 4) {
    pGVar2 = context->outputArray;
    iVar3 = context->numFragmentOutputs;
    uVar5 = 0;
    uVar6 = (ulong)(uint)numPackets;
    if (numPackets < 1) {
      uVar6 = uVar5;
    }
    for (; uVar5 != uVar6; uVar5 = uVar5 + 1) {
      for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
        iVar4 = ((uint)lVar8 | (int)uVar5 * 4) * iVar3;
        pGVar2[iVar4].v.uData[0] = (deUint32)local_58.m_data[0];
        pGVar2[iVar4].v.uData[1] = (deUint32)local_58.m_data[1];
        pGVar2[iVar4].v.uData[2] = (deUint32)local_58.m_data[2];
        pGVar2[iVar4].v.uData[3] = (deUint32)local_58.m_data[3];
      }
    }
  }
  else if (iVar3 == 0x1e) {
    pGVar2 = context->outputArray;
    iVar3 = 0;
    if (numPackets < 1) {
      numPackets = 0;
    }
    for (iVar4 = 0; iVar4 != numPackets; iVar4 = iVar4 + 1) {
      for (iVar7 = 0; iVar7 != 4; iVar7 = iVar7 + 1) {
        iVar1 = context->numFragmentOutputs;
        *(undefined8 *)&pGVar2[(iVar3 + iVar7) * iVar1].v = local_38;
        *(undefined8 *)((long)&pGVar2[(iVar3 + iVar7) * iVar1].v + 8) = uStack_30;
      }
      iVar3 = iVar3 + 4;
    }
  }
  else if (iVar3 == 0x22) {
    pGVar2 = context->outputArray;
    iVar3 = 0;
    if (numPackets < 1) {
      numPackets = 0;
    }
    for (iVar4 = 0; iVar4 != numPackets; iVar4 = iVar4 + 1) {
      for (iVar7 = 0; iVar7 != 4; iVar7 = iVar7 + 1) {
        iVar1 = context->numFragmentOutputs;
        *(undefined8 *)&pGVar2[(iVar3 + iVar7) * iVar1].v = local_48;
        *(undefined8 *)((long)&pGVar2[(iVar3 + iVar7) * iVar1].v + 8) = uStack_40;
      }
      iVar3 = iVar3 + 4;
    }
  }
  return;
}

Assistant:

void FlatColorShader::shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	const tcu::Vec4		color	(m_uniforms[0].value.f4);
	const tcu::IVec4	icolor	= castVectorSaturate<deInt32>(color);
	const tcu::UVec4	uicolor	= castVectorSaturate<deUint32>(color);

	DE_UNREF(packets);

	if (m_outputType == glu::TYPE_FLOAT_VEC4)
	{
		for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
			rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, color);
	}
	else if (m_outputType == glu::TYPE_INT_VEC4)
	{
		for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
			rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, icolor);
	}
	else if (m_outputType == glu::TYPE_UINT_VEC4)
	{
		for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
			rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, uicolor);
	}
	else
		DE_ASSERT(DE_FALSE);
}